

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<int,_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase2
               (char lhs,
               SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int *in_RDX;
  char in_DIL;
  int tmp;
  undefined4 in_stack_ffffffffffffffe4;
  undefined7 in_stack_fffffffffffffff0;
  
  uVar3 = (uint)in_DIL;
  cVar1 = std::numeric_limits<char>::min();
  if ((uVar3 == (int)cVar1) &&
     (iVar4 = ::SafeInt::operator_cast_to_int
                        ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT44(in_stack_ffffffffffffffe4,uVar3)), iVar4 == -1)) {
    bVar2 = div_negate_min<int,_char,_true>::Value((int *)(ulong)uVar3);
    if (bVar2) {
      SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
                ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),in_RDX);
      return true;
    }
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }